

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_type_extension.cpp
# Opt level: O1

hash_t __thiscall duckdb::TypeInfo::GetHash(TypeInfo *this)

{
  ulong uVar1;
  hash_t hVar2;
  
  uVar1 = (ulong)this->type * -0x2917014799a6026d;
  uVar1 = (uVar1 >> 0x20 ^ uVar1) * -0x2917014799a6026d;
  hVar2 = Hash<char_const*>((this->alias)._M_dataplus._M_p);
  return hVar2 ^ uVar1 ^ uVar1 >> 0x20;
}

Assistant:

hash_t TypeInfo::GetHash() const {
	const auto h_type_id = Hash(type);
	const auto h_alias = Hash(alias.c_str());
	return CombineHash(h_type_id, h_alias);
}